

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepWriteParameters(void *arkode_mem,FILE *fp)

{
  FILE *in_RSI;
  int retval;
  int flag;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  ARKodeMem local_20;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (ARKodeMem *)in_stack_ffffffffffffffc8,(ARKodeARKStepMem *)0xe88eb9);
  if (local_4 == 0) {
    local_4 = arkWriteParameters(in_stack_ffffffffffffffc8,(FILE *)0xe88ee0);
    if (local_4 == 0) {
      fprintf(in_RSI,"ARKStep time step module parameters:\n");
      fprintf(in_RSI,"  Method order %i\n",(ulong)*(uint *)((long)in_stack_ffffffffffffffd8 + 0x50))
      ;
      if (*(int *)((long)in_stack_ffffffffffffffd8 + 0x10) != 0) {
        fprintf(in_RSI,"  Linear implicit problem");
        if (*(int *)((long)in_stack_ffffffffffffffd8 + 0x14) == 0) {
          fprintf(in_RSI," (time-independent Jacobian)\n");
        }
        else {
          fprintf(in_RSI," (time-dependent Jacobian)\n");
        }
      }
      if ((*(int *)((long)in_stack_ffffffffffffffd8 + 0x18) == 0) ||
         (*(int *)((long)in_stack_ffffffffffffffd8 + 0x1c) == 0)) {
        if (*(int *)((long)in_stack_ffffffffffffffd8 + 0x1c) == 0) {
          fprintf(in_RSI,"  Explicit integrator\n");
        }
        else {
          fprintf(in_RSI,"  Implicit integrator\n");
        }
      }
      else {
        fprintf(in_RSI,"  ImEx integrator\n");
      }
      if (*(int *)((long)in_stack_ffffffffffffffd8 + 0x1c) != 0) {
        fprintf(in_RSI,"  Implicit predictor method = %i\n",
                (ulong)*(uint *)((long)in_stack_ffffffffffffffd8 + 0xb0));
        fprintf(in_RSI,"  Implicit solver tolerance coefficient = %.16g\n",
                *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0xe0));
        fprintf(in_RSI,"  Maximum number of nonlinear corrections = %i\n",
                (ulong)*(uint *)((long)in_stack_ffffffffffffffd8 + 0xf8));
        fprintf(in_RSI,"  Nonlinear convergence rate constant = %.16g\n",
                *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0xb8));
        fprintf(in_RSI,"  Nonlinear divergence tolerance = %.16g\n",
                *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0xc0));
        fprintf(in_RSI,"  Gamma factor LSetup tolerance = %.16g\n",
                *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0xa8));
        fprintf(in_RSI,"  Number of steps between LSetup calls = %i\n",
                (ulong)*(uint *)((long)in_stack_ffffffffffffffd8 + 0xe8));
      }
      fprintf(in_RSI,"\n");
      local_4 = 0;
    }
    else {
      arkProcessError(local_20,-0x15,"ARKode::ARKStep","ARKStepWriteParameters",
                      "Error writing ARKode infrastructure parameters");
    }
  }
  return local_4;
}

Assistant:

int ARKStepWriteParameters(void *arkode_mem, FILE *fp)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int flag, retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepWriteParameters",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* output ARKode infrastructure parameters first */
  flag = arkWriteParameters(ark_mem, fp);
  if (flag != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                    "ARKStepWriteParameters",
                    "Error writing ARKode infrastructure parameters");
    return(flag);
  }

  /* print integrator parameters to file */
  fprintf(fp, "ARKStep time step module parameters:\n");
  fprintf(fp, "  Method order %i\n",step_mem->q);
  if (step_mem->linear) {
    fprintf(fp, "  Linear implicit problem");
    if (step_mem->linear_timedep) {
      fprintf(fp, " (time-dependent Jacobian)\n");
    } else {
      fprintf(fp, " (time-independent Jacobian)\n");
    }
  }
  if (step_mem->explicit && step_mem->implicit) {
    fprintf(fp, "  ImEx integrator\n");
  } else if (step_mem->implicit) {
    fprintf(fp, "  Implicit integrator\n");
  } else {
    fprintf(fp, "  Explicit integrator\n");
  }

  if (step_mem->implicit) {
    fprintf(fp, "  Implicit predictor method = %i\n",step_mem->predictor);
    fprintf(fp, "  Implicit solver tolerance coefficient = %"RSYM"\n",step_mem->nlscoef);
    fprintf(fp, "  Maximum number of nonlinear corrections = %i\n",step_mem->maxcor);
    fprintf(fp, "  Nonlinear convergence rate constant = %"RSYM"\n",step_mem->crdown);
    fprintf(fp, "  Nonlinear divergence tolerance = %"RSYM"\n",step_mem->rdiv);
    fprintf(fp, "  Gamma factor LSetup tolerance = %"RSYM"\n",step_mem->dgmax);
    fprintf(fp, "  Number of steps between LSetup calls = %i\n",step_mem->msbp);
  }
  fprintf(fp, "\n");

  return(ARK_SUCCESS);
}